

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O1

int __thiscall
EnvironmentROBARM::GetFromToHeuristic(EnvironmentROBARM *this,int FromStateID,int ToStateID)

{
  pointer ppEVar1;
  ENVROBARMHASHENTRY *pEVar2;
  ENVROBARMHASHENTRY *pEVar3;
  long lVar4;
  
  ppEVar1 = (this->EnvROBARM).StateID2CoordTable.
            super__Vector_base<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar2 = ppEVar1[FromStateID];
  pEVar3 = ppEVar1[ToStateID];
  lVar4 = (long)(this->EnvROBARMCfg).EnvWidth_c;
  return (this->EnvROBARM).Heur[(ulong)pEVar3->endeffy * lVar4 + (ulong)pEVar3->endeffx]
         [(ulong)pEVar2->endeffy * lVar4 + (ulong)pEVar2->endeffx];
}

Assistant:

int EnvironmentROBARM::GetFromToHeuristic(int FromStateID, int ToStateID)
{
#if USE_HEUR==0
    return 0;
#endif

#if DEBUG
    if(FromStateID >= (int)EnvROBARM.StateID2CoordTable.size()
        || ToStateID >= (int)EnvROBARM.StateID2CoordTable.size())
    {
        throw SBPL_Exception("ERROR in EnvROBARM... function: stateID illegal");
    }
#endif

    //get X, Y for the state
    EnvROBARMHashEntry_t* FromHashEntry = EnvROBARM.StateID2CoordTable[FromStateID];
    EnvROBARMHashEntry_t* ToHashEntry = EnvROBARM.StateID2CoordTable[ToStateID];

    int h =
            EnvROBARM.Heur[XYTO2DIND(ToHashEntry->endeffx, ToHashEntry->endeffy)][XYTO2DIND(FromHashEntry->endeffx, FromHashEntry->endeffy)];

    /*
     if(ToStateID != EnvROBARM.goalHashEntry->stateID)
     {
     //also consider the distanceincoord

     //get the heuristic based on angles
     unsigned int hangles = distanceincoord(FromHashEntry->coord, ToHashEntry->coord);

     //the heuristic is the max of the two
     h = __max(h, hangles);
     }
     */

    return h;
}